

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O0

void __thiscall
kratos::Var::Var(Var *this,Generator *m,string *name,uint32_t var_width,
                vector<unsigned_int,_std::allocator<unsigned_int>_> *size,bool is_signed,
                VarType type)

{
  bool bVar1;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  aVar2;
  undefined1 auVar3 [16];
  format_args args;
  format_args args_00;
  format_args args_01;
  string_view format_str;
  string_view format_str_00;
  string_view format_str_01;
  string local_228;
  undefined1 local_201;
  string local_200;
  undefined1 local_1d9;
  string local_1d8;
  byte local_1a1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvStack_1a0;
  bool is_signed_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *size_local;
  string *psStack_190;
  uint32_t var_width_local;
  string *name_local;
  Generator *m_local;
  Var *this_local;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  local_170;
  basic_string_view<char> local_168;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  local_158;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_148;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs;
  char *local_138;
  string *local_130;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_128;
  basic_string_view<char> local_118;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  local_108;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_f8;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs_1;
  char *local_e8;
  string *local_e0;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_d8;
  basic_string_view<char> local_c8;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  local_b8;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_a0;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs_2;
  char *local_90;
  string *local_88;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_80;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_78;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_70;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_68;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_60;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_58;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_50;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_48;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_40;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_38;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_30;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_28;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_20;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_18;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_10;
  
  aVar2._4_4_ = 0;
  aVar2._0_4_ = type;
  local_1a1 = is_signed;
  pvStack_1a0 = size;
  size_local._4_4_ = var_width;
  psStack_190 = name;
  name_local = (string *)m;
  m_local = (Generator *)this;
  std::enable_shared_from_this<kratos::Var>::enable_shared_from_this
            (&this->super_enable_shared_from_this<kratos::Var>);
  IRNode::IRNode(&this->super_IRNode,VarKind);
  (this->super_IRNode)._vptr_IRNode = (_func_int **)&PTR_accept_0058b738;
  std::__cxx11::string::string((string *)&this->name,(string *)psStack_190);
  this->var_width_ = size_local._4_4_;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->size_,size);
  std::
  unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>
  ::unordered_map(&this->size_param_);
  this->is_signed_ = (bool)(local_1a1 & 1);
  std::
  unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
  ::unordered_set(&this->sinks_);
  std::
  unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
  ::unordered_set(&this->sources_);
  this->type_ = type;
  std::
  vector<std::shared_ptr<kratos::VarConcat>,_std::allocator<std::shared_ptr<kratos::VarConcat>_>_>::
  vector(&this->concat_vars_);
  std::
  vector<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>::
  vector(&this->slices_);
  std::__cxx11::string::string((string *)&this->before_var_str_);
  std::__cxx11::string::string((string *)&this->after_var_str_);
  this->explicit_array_ = false;
  this->width_param_ = (Var *)0x0;
  this->raw_type_param_ = (Param *)0x0;
  this->is_packed_ = true;
  this->generator_ = (Generator *)name_local;
  std::
  set<std::shared_ptr<kratos::VarCasted>,_std::less<std::shared_ptr<kratos::VarCasted>_>,_std::allocator<std::shared_ptr<kratos::VarCasted>_>_>
  ::set(&this->casted_);
  std::
  unordered_map<unsigned_int,_std::shared_ptr<kratos::VarExtend>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<kratos::VarExtend>_>_>_>
  ::unordered_map(&this->extended_);
  if (((name_local == (string *)0x0) && (type != ConstValue)) && (type != Iter)) {
    local_1d9 = 1;
    auVar3 = __cxa_allocate_exception(0x10);
    local_130 = &local_1d8;
    local_138 = "module is null for {0}";
    vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)psStack_190;
    local_158.named_args.data =
         (named_arg_info<char> *)
         fmt::v7::make_args_checked<std::__cxx11::string_const&,char[23],char>
                   ((format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)"module is null for {0}",(v7 *)psStack_190,auVar3._8_8_,
                    (remove_reference_t<const_std::__cxx11::basic_string<char>_&> *)
                    "module is null for {0}");
    local_148 = &local_158;
    local_168 = fmt::v7::to_string_view<char,_0>(local_138);
    local_58 = (basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                *)&this_local;
    local_60 = local_148;
    local_50 = local_148;
    local_40 = local_148;
    local_48 = local_58;
    fmt::v7::
    basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    ::basic_format_args(local_58,0xd,
                        (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                         *)&local_148->string);
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = aVar2.values_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)local_170.values_;
    format_str.size_ = (size_t)this_local;
    format_str.data_ = (char *)local_168.size_;
    fmt::v7::detail::vformat_abi_cxx11_(&local_1d8,(detail *)local_168.data_,format_str,args);
    UserException::UserException(auVar3._0_8_,&local_1d8);
    local_1d9 = 0;
    __cxa_throw(auVar3._0_8_,&UserException::typeinfo,UserException::~UserException);
  }
  bVar1 = is_valid_variable_name(psStack_190);
  if (!bVar1) {
    local_201 = 1;
    auVar3 = __cxa_allocate_exception(0x10);
    local_e0 = &local_200;
    local_e8 = "{0} is a SystemVerilog keyword";
    vargs_1 = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)psStack_190;
    local_108.named_args.data =
         (named_arg_info<char> *)
         fmt::v7::make_args_checked<std::__cxx11::string_const&,char[31],char>
                   ((format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)"{0} is a SystemVerilog keyword",(v7 *)psStack_190,auVar3._8_8_,
                    (remove_reference_t<const_std::__cxx11::basic_string<char>_&> *)
                    "{0} is a SystemVerilog keyword");
    local_f8 = &local_108;
    local_118 = fmt::v7::to_string_view<char,_0>(local_e8);
    local_68 = &local_128;
    local_70 = local_f8;
    local_38 = local_f8;
    local_28 = local_f8;
    local_30 = local_68;
    fmt::v7::
    basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    ::basic_format_args(local_68,0xd,
                        (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                         *)&local_f8->string);
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = aVar2.values_;
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)local_128.field_1.values_;
    format_str_00.size_ = local_128.desc_;
    format_str_00.data_ = (char *)local_118.size_;
    fmt::v7::detail::vformat_abi_cxx11_(&local_200,(detail *)local_118.data_,format_str_00,args_00);
    UserException::UserException(auVar3._0_8_,&local_200);
    local_201 = 0;
    __cxa_throw(auVar3._0_8_,&UserException::typeinfo,UserException::~UserException);
  }
  if (size_local._4_4_ == 0) {
    auVar3 = __cxa_allocate_exception(0x10);
    local_88 = &local_228;
    local_90 = "variable {0} cannot have size 0";
    vargs_2 = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)psStack_190;
    local_b8.named_args.data =
         (named_arg_info<char> *)
         fmt::v7::make_args_checked<std::__cxx11::string_const&,char[32],char>
                   ((format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)"variable {0} cannot have size 0",(v7 *)psStack_190,auVar3._8_8_,
                    (remove_reference_t<const_std::__cxx11::basic_string<char>_&> *)
                    "variable {0} cannot have size 0");
    local_a0 = &local_b8;
    local_c8 = fmt::v7::to_string_view<char,_0>(local_90);
    local_78 = &local_d8;
    local_80 = local_a0;
    local_20 = local_a0;
    local_10 = local_a0;
    local_18 = local_78;
    fmt::v7::
    basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    ::basic_format_args(local_78,0xd,
                        (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                         *)&local_a0->string);
    args_01.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = aVar2.values_;
    args_01.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)local_d8.field_1.values_;
    format_str_01.size_ = local_d8.desc_;
    format_str_01.data_ = (char *)local_c8.size_;
    fmt::v7::detail::vformat_abi_cxx11_(&local_228,(detail *)local_c8.data_,format_str_01,args_01);
    UserException::UserException(auVar3._0_8_,&local_228);
    __cxa_throw(auVar3._0_8_,&UserException::typeinfo,UserException::~UserException);
  }
  return;
}

Assistant:

Var::Var(kratos::Generator *m, const std::string &name, uint32_t var_width,
         std::vector<uint32_t> size, bool is_signed, kratos::VarType type)
    : IRNode(IRNodeKind::VarKind),
      name(name),
      var_width_(var_width),
      size_(std::move(size)),
      is_signed_(is_signed),
      type_(type),
      generator_(m) {
    // only constant allows to be null generator
    if (m == nullptr && type != VarType::ConstValue && type != VarType::Iter)
        throw UserException(::format("module is null for {0}", name));
    if (!is_valid_variable_name(name))
        throw UserException(::format("{0} is a SystemVerilog keyword", name));
    if (var_width == 0) throw UserException(::format("variable {0} cannot have size 0", name));
}